

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_ineq.h
# Opt level: O0

void __thiscall
mp::
Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
::ConvertCondIneq<1>
          (Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
           *this,ItemType *cc,int value,double eps)

{
  bool bVar1;
  AlgConRhs<1> rr;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *this_00;
  int in_EDX;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  NodeRange NVar3;
  int res;
  ConType *con;
  undefined8 in_stack_fffffffffffffc28;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffc30;
  LinTerms *in_stack_fffffffffffffc38;
  LinTerms *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc4c;
  undefined1 uVar4;
  LinTerms *in_stack_fffffffffffffc50;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
  *in_stack_fffffffffffffc58;
  AlgConRhs<1> in_stack_fffffffffffffc60;
  AlgConRhs<1> local_358 [6];
  double in_stack_fffffffffffffcd8;
  double in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffcec;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffcf0;
  AlgConRhs<1> local_150 [36];
  int local_2c;
  ConType *local_28;
  double local_20;
  undefined4 local_14;
  FunctionalConstraint *local_10;
  
  uVar4 = (undefined1)((uint)in_stack_fffffffffffffc4c >> 0x18);
  var = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
             GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                            *)0x2597b1);
  local_2c = FunctionalConstraint::GetResultVar(local_10);
  bVar1 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::empty
                    ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)0x2597da);
  if (bVar1) {
    dVar2 = AlgConRhs<1>::rhs(&local_28->super_AlgConRhs<1>);
    if (0.0 < (dVar2 + local_20) * 1.0) {
      BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::GetMC(in_RDI);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                        in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
  }
  else {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::is_fixed(in_stack_fffffffffffffc30,var);
    if (bVar1) {
      BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::GetMC(in_RDI);
      dVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::fixed_value(in_stack_fffffffffffffc30,var);
      if (((double)local_14 == dVar2) && (!NAN((double)local_14) && !NAN(dVar2))) {
        rr.rhs_ = (double)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ::GetMC(in_RDI);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::GetBody(local_28);
        LinTerms::LinTerms(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        dVar2 = AlgConRhs<1>::rhs(&local_28->super_AlgConRhs<1>);
        AlgConRhs<1>::AlgConRhs(local_150,dVar2 + local_20);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffc58
                   ,in_stack_fffffffffffffc50,rr,(bool)uVar4);
        FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
        ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                  ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)rr.rhs_,
                   (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffc58
                  );
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffc30
                  );
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffc30);
      }
    }
    else {
      this_00 = (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
                BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ::GetMC(in_RDI);
      uVar4 = local_14._3_1_;
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::GetBody(local_28);
      LinTerms::LinTerms((LinTerms *)this_00,in_stack_fffffffffffffc38);
      dVar2 = AlgConRhs<1>::rhs(&local_28->super_AlgConRhs<1>);
      AlgConRhs<1>::AlgConRhs(local_358,dVar2 + local_20);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffc58,
                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc60,(bool)uVar4);
      IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
      IndicatorConstraint(this_00,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                          (int)in_stack_fffffffffffffc38,
                          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                          in_stack_fffffffffffffc30);
      NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)in_stack_fffffffffffffc60.rhs_,in_stack_fffffffffffffc58);
      IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
      ~IndicatorConstraint
                ((IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
                 NVar3.ir_);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar3.ir_);
      LinTerms::~LinTerms((LinTerms *)NVar3.ir_);
    }
  }
  return;
}

Assistant:

void ConvertCondIneq(const ItemType& cc, int value, double eps) {
    const auto& con = cc.GetConstraint();
    const auto res = cc.GetResultVar();
    using AlgConOutput = AlgebraicConstraint<
      typename AlgCon::BodyType, AlgConRhs<kind> >;
    if (con.empty()) {                    // empty body
      if (kind*(con.rhs() + eps) > 0.0)
        GetMC().NarrowVarBounds(res, !value, !value);    // fix result
    } else {
      if (GetMC().is_fixed(res)) {
        if (value==GetMC().fixed_value(res)) { // result already fixed,
          GetMC().AddConstraint(               // add static constraint
                AlgConOutput{ con.GetBody(), con.rhs()+eps } );
        }                                      // otherwise, forget
      } else {
        GetMC().AddConstraint( IndicatorConstraint< AlgConOutput >(
                                res, value,
                                { con.GetBody(), con.rhs()+eps }));
      }
    }
  }